

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateNotImplementedMethods
          (ServiceGenerator *this,Printer *printer)

{
  MethodDescriptor *pMVar1;
  cpp *pcVar2;
  long lVar3;
  allocator<char> local_313;
  allocator<char> local_312;
  allocator<char> local_311;
  Options *local_310;
  int local_304;
  Printer *local_300;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  Sub local_258 [3];
  
  local_310 = (Options *)this;
  local_300 = printer;
  for (local_304 = 0; local_304 < *(int *)((ServiceDescriptor *)local_310->access_info_map + 0x38);
      local_304 = local_304 + 1) {
    pMVar1 = ServiceDescriptor::method((ServiceDescriptor *)local_310->access_info_map,local_304);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"name",&local_311);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              (local_258,&local_2b8,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pMVar1 + 8));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"input",&local_312);
    pcVar2 = (cpp *)google::protobuf::MethodDescriptor::input_type();
    QualifiedClassName_abi_cxx11_(&local_298,pcVar2,(Descriptor *)local_310->split_map,local_310);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_258 + 1,&local_278,&local_298);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"output",&local_313);
    pcVar2 = (cpp *)google::protobuf::MethodDescriptor::output_type();
    QualifiedClassName_abi_cxx11_(&local_2d8,pcVar2,(Descriptor *)local_310->split_map,local_310);
    io::Printer::Sub::Sub<std::__cxx11::string>(local_258 + 2,&local_2f8,&local_2d8);
    google::protobuf::io::Printer::Emit
              (local_300,local_258,3,0x124,
               "\n          void $classname$::$name$(::$proto_ns$::RpcController* controller,\n                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {\n            controller->SetFailed(\"Method $name$() not implemented.\");\n            done->Run();\n          }\n        "
              );
    lVar3 = 0x170;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&local_258[0].key_._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0xb8;
    } while (lVar3 != -0xb8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateNotImplementedMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
        },
        R"cc(
          void $classname$::$name$(::$proto_ns$::RpcController* controller,
                                   const $input$*, $output$*, ::google::protobuf::Closure* done) {
            controller->SetFailed("Method $name$() not implemented.");
            done->Run();
          }
        )cc");
  }
}